

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QLineF>::emplace<QLineF>
          (QPodArrayOps<QLineF> *this,qsizetype i,QLineF *args)

{
  QLineF **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  QLineF *pQVar8;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QLineF>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0033c592:
    qVar4 = (args->pt1).xp;
    qVar5 = (args->pt1).yp;
    qVar6 = (args->pt2).xp;
    qVar7 = (args->pt2).yp;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QLineF>).size != 0);
    QArrayDataPointer<QLineF>::detachAndGrow
              (&this->super_QArrayDataPointer<QLineF>,where,1,(QLineF **)0x0,
               (QArrayDataPointer<QLineF> *)0x0);
    pQVar8 = createHole(this,where,i,1);
    (pQVar8->pt1).xp = qVar4;
    (pQVar8->pt1).yp = qVar5;
    (pQVar8->pt2).xp = qVar6;
    (pQVar8->pt2).yp = qVar7;
  }
  else {
    if (((this->super_QArrayDataPointer<QLineF>).size == i) &&
       (pQVar8 = (this->super_QArrayDataPointer<QLineF>).ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar8 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      qVar4 = (args->pt1).xp;
      qVar5 = (args->pt1).yp;
      qVar6 = (args->pt2).yp;
      pQVar8[i].pt2.xp = (args->pt2).xp;
      pQVar8[i].pt2.yp = qVar6;
      pQVar8[i].pt1.xp = qVar4;
      pQVar8[i].pt1.yp = qVar5;
    }
    else {
      if ((i != 0) ||
         (pQVar8 = (this->super_QArrayDataPointer<QLineF>).ptr,
         (QLineF *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pQVar8)) goto LAB_0033c592;
      qVar4 = (args->pt1).xp;
      qVar5 = (args->pt1).yp;
      qVar6 = (args->pt2).yp;
      pQVar8[-1].pt2.xp = (args->pt2).xp;
      pQVar8[-1].pt2.yp = qVar6;
      pQVar8[-1].pt1.xp = qVar4;
      pQVar8[-1].pt1.yp = qVar5;
      ppQVar1 = &(this->super_QArrayDataPointer<QLineF>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QLineF>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }